

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O1

base_learner * cb_algs_setup(options_i *options,vw *all)

{
  uint32_t *location;
  _func_int **pp_Var1;
  vw *all_00;
  int iVar2;
  cb *dat;
  option_group_definition *poVar3;
  vw_exception *this;
  size_t sVar4;
  base_learner *l;
  single_learner *base;
  learner<CB_ALGS::cb,_example> *plVar5;
  code *pcVar6;
  label_type_t lVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  size_t ws;
  byte bVar11;
  bool eval;
  string type_string;
  size_type __dnew_3;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  bool local_469;
  _func_int ***local_468;
  _func_int **local_460;
  _func_int **local_458 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  uint32_t *local_428;
  vw *local_420;
  long local_418;
  _func_int ***local_410;
  _func_int **local_408;
  _func_int **local_400 [2];
  _func_int ***local_3f0;
  _func_int **local_3e8;
  _func_int **local_3e0 [2];
  option_group_definition local_3d0;
  string local_398;
  long *local_378;
  long local_370;
  long local_368 [2];
  string local_358;
  string local_338;
  string local_318;
  undefined1 local_2f8 [112];
  bool local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  undefined1 local_258 [18];
  undefined1 uStack_246;
  undefined1 uStack_245;
  undefined2 local_244;
  undefined1 uStack_242;
  undefined1 local_241;
  string local_228 [64];
  bool local_1e8;
  ios_base local_1d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar11 = 0;
  dat = calloc_or_throw<CB_ALGS::cb>(1);
  (dat->cbcs).cb_type = 0;
  *(undefined8 *)&(dat->cbcs).num_actions = 0;
  (dat->cbcs).pred_scores.costs._begin = (wclass *)0x0;
  (dat->cbcs).pred_scores.costs._end = (wclass *)0x0;
  (dat->cbcs).pred_scores.costs.end_array = (wclass *)0x0;
  (dat->cbcs).pred_scores.costs.erase_count = 0;
  (dat->cbcs).scorer = (single_learner *)0x0;
  *(undefined8 *)&(dat->cbcs).avg_loss_regressors = 0;
  (dat->cbcs).nb_ex_regressors = 0;
  (dat->cbcs).last_pred_reg = 0.0;
  (dat->cbcs).last_correct_cost = 0.0;
  (dat->cbcs).known_cost = (cb_class *)0x0;
  (dat->cb_cs_ld).costs._begin = (wclass *)0x0;
  (dat->cb_cs_ld).costs._end = (wclass *)0x0;
  (dat->cb_cs_ld).costs.end_array = (wclass *)0x0;
  (dat->cb_cs_ld).costs.erase_count = 0;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448.field_2._M_allocated_capacity._0_2_ = 0x7264;
  local_448._M_string_length = 2;
  local_448.field_2._M_local_buf[2] = '\0';
  local_469 = false;
  local_258._0_8_ = (_func_int **)0x19;
  local_468 = local_458;
  local_468 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_468,(ulong)local_258);
  local_458[0] = (_func_int **)local_258._0_8_;
  builtin_strncpy((char *)((long)local_468 + 9),"l Bandit",8);
  builtin_strncpy((char *)((long)local_468 + 0x11)," Options",8);
  *(undefined4 *)local_468 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_468 + 4),"extu",4);
  *(undefined4 *)(local_468 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_468 + 0xc),"andi",4);
  local_460 = (_func_int **)local_258._0_8_;
  *(char *)((long)local_468 + local_258._0_8_) = '\0';
  local_3d0.m_name._M_dataplus._M_p = (pointer)&local_3d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,local_468,(char *)(local_258._0_8_ + (long)local_468));
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398.field_2._M_allocated_capacity._0_2_ = 0x6263;
  local_398._M_string_length = 2;
  local_398.field_2._M_local_buf[2] = '\0';
  location = &(dat->cbcs).num_actions;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_258,&local_398,location);
  local_1e8 = true;
  local_3f0 = local_3e0;
  local_2f8._0_8_ = (_func_int **)0x2d;
  local_3f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)local_2f8);
  local_3e0[0] = (_func_int **)local_2f8._0_8_;
  builtin_strncpy((char *)((long)local_3f0 + 0x1d),"g with <",8);
  builtin_strncpy((char *)((long)local_3f0 + 0x25),"k> costs",8);
  local_3f0[2] = (_func_int **)0x656c207469646e61;
  local_3f0[3] = (_func_int **)0x7720676e696e7261;
  *local_3f0 = (_func_int **)0x746e6f6320657355;
  local_3f0[1] = (_func_int **)0x62206c6175747865;
  local_3e8 = (_func_int **)local_2f8._0_8_;
  *(char *)((long)local_3f0 + local_2f8._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_228);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_3d0,(typed_option<unsigned_int> *)local_258);
  local_338.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_338.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_338._M_string_length = 7;
  local_338.field_2._M_local_buf[7] = '\0';
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2f8,&local_338,&local_448);
  local_288 = true;
  local_410 = local_400;
  local_d0._0_8_ = (_func_int **)0x2e;
  local_410 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_410,(ulong)local_d0);
  local_400[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_410 + 0x1e),"e in {ip",8);
  builtin_strncpy((char *)((long)local_410 + 0x26),"s,dm,dr}",8);
  local_410[2] = (_func_int **)0x646f6874656d2074;
  local_410[3] = (_func_int **)0x20657375206f7420;
  *local_410 = (_func_int **)0x75747865746e6f63;
  local_410[1] = (_func_int **)0x69646e6162206c61;
  local_408 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_410 + local_d0._0_8_) = '\0';
  local_428 = location;
  local_420 = all;
  std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar3,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_2f8);
  local_358.field_2._M_allocated_capacity._0_4_ = 0x6c617665;
  local_358._M_string_length = 4;
  local_358.field_2._M_local_buf[4] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_d0,&local_358,&local_469)
  ;
  local_418 = 0x29;
  local_378 = local_368;
  local_378 = (long *)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_418);
  local_368[0] = local_418;
  builtin_strncpy((char *)((long)local_378 + 0x19),"than opt",8);
  builtin_strncpy((char *)((long)local_378 + 0x21),"imizing.",8);
  local_378[2] = 0x7265687461722079;
  local_378[3] = 0x706f206e61687420;
  *local_378 = 0x657461756c617645;
  local_378[1] = 0x63696c6f70206120;
  local_370 = local_418;
  *(char *)((long)local_378 + local_418) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_d0);
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  local_d0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  local_2f8._0_8_ = &PTR__typed_option_002d5018;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  local_258._0_8_ = &PTR__typed_option_002d50f8;
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_3d0);
  pp_Var1 = (_func_int **)(local_258 + 0x10);
  local_258._16_2_ = 0x6263;
  local_258._8_8_ = (pointer)0x2;
  uStack_246 = 0;
  local_258._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options,local_258);
  if ((_func_int **)local_258._0_8_ != pp_Var1) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((char)iVar2 == '\0') {
    plVar5 = (learner<CB_ALGS::cb,_example> *)0x0;
    goto LAB_00251f03;
  }
  local_258._16_2_ = 0x6263;
  uStack_246 = 0x5f;
  uStack_245 = 0x74;
  local_244 = 0x7079;
  uStack_242 = 0x65;
  local_258._8_8_ = (pointer)0x7;
  local_241 = 0;
  local_258._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_258._0_8_ != pp_Var1) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((char)iVar2 == '\0') {
    local_258._16_2_ = 0x6263;
    uStack_246 = 0x5f;
    uStack_245 = 0x74;
    local_244 = 0x7079;
    uStack_242 = 0x65;
    local_258._8_8_ = (pointer)0x7;
    local_241 = 0;
    local_258._0_8_ = pp_Var1;
    (*options->_vptr_options_i[5])(options,local_258,&local_448);
    if ((_func_int **)local_258._0_8_ != pp_Var1) {
      operator_delete((void *)local_258._0_8_);
    }
    (**options->_vptr_options_i)(options,&local_3d0);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_448);
  if (iVar2 == 0) {
LAB_00251c4e:
    ws = 2;
    sVar4 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_448);
    if (iVar2 == 0) {
      sVar4 = 1;
      ws = 1;
      if (local_469 == true) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_258 + 0x10),
                   "direct method can not be used for evaluation --- it is biased.",0x3e);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb_algs.cc"
                   ,0xa5,&local_318);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_448);
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "warning: cb_type must be in {\'ips\',\'dm\',\'dr\'}; resetting to dr.",0x3f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        goto LAB_00251c4e;
      }
      ws = 1;
      sVar4 = 2;
    }
  }
  (dat->cbcs).cb_type = sVar4;
  local_258._16_2_ = 0x7363;
  uStack_246 = 0x6f;
  uStack_245 = 0x61;
  local_244 = 0x61;
  local_258._8_8_ = (pointer)0x5;
  local_258._0_8_ = pp_Var1;
  iVar2 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_258._0_8_ != pp_Var1) {
    operator_delete((void *)local_258._0_8_);
  }
  all_00 = local_420;
  if ((char)iVar2 == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_258);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_258 + 0x10));
    local_2f8._16_4_ = 0x616f7363;
    local_2f8._20_2_ = 0x61;
    local_2f8._8_8_ = (pointer)0x5;
    local_2f8._0_8_ = local_2f8 + 0x10;
    std::__cxx11::stringbuf::str();
    (*options->_vptr_options_i[5])(options,local_2f8,local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_258);
    std::ios_base::~ios_base(local_1d8);
  }
  l = setup_base(options,all_00);
  base = LEARNER::as_singleline<char,char>(l);
  plVar10 = &all_00->p->lp;
  if (local_469 == true) {
    ppuVar9 = &CB_EVAL::cb_eval;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    lVar7 = cb_eval;
  }
  else {
    ppuVar9 = &CB::cb_label;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    lVar7 = cb;
  }
  all_00->label_type = lVar7;
  if (local_469 == false) {
    plVar5 = LEARNER::learner<CB_ALGS::cb,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,CB_ALGS::predict_or_learn<true>,CB_ALGS::predict_or_learn<false>,ws
                        ,multiclass);
    pcVar6 = CB_ALGS::finish_example;
  }
  else {
    plVar5 = LEARNER::learner<CB_ALGS::cb,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,CB_ALGS::learn_eval,CB_ALGS::predict_eval,ws,multiclass);
    pcVar6 = CB_ALGS::eval_finish_example;
  }
  *(undefined8 *)(plVar5 + 0x58) = *(undefined8 *)(plVar5 + 0x18);
  *(code **)(plVar5 + 0x68) = pcVar6;
  (dat->cbcs).scorer = all_00->scorer;
  *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
  *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
  *(code **)(plVar5 + 200) = CB_ALGS::finish;
  dat = (cb *)0x0;
LAB_00251f03:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_3d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != &local_3d0.m_name.field_2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if (dat != (cb *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar5;
}

Assistant:

base_learner* cb_algs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb>();
  std::string type_string = "dr";
  bool eval = false;

  option_group_definition new_options("Contextual Bandit Options");
  new_options
      .add(make_option("cb", data->cbcs.num_actions).keep().help("Use contextual bandit learning with <k> costs"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"))
      .add(make_option("eval", eval).help("Evaluate a policy rather than optimizing."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb"))
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  cb_to_cs& c = data->cbcs;

  size_t problem_multiplier = 2;  // default for DR
  if (type_string.compare("dr") == 0)
    c.cb_type = CB_TYPE_DR;
  else if (type_string.compare("dm") == 0)
  {
    if (eval)
      THROW("direct method can not be used for evaluation --- it is biased.");
    c.cb_type = CB_TYPE_DM;
    problem_multiplier = 1;
  }
  else if (type_string.compare("ips") == 0)
  {
    c.cb_type = CB_TYPE_IPS;
    problem_multiplier = 1;
  }
  else
  {
    std::cerr << "warning: cb_type must be in {'ips','dm','dr'}; resetting to dr." << std::endl;
    c.cb_type = CB_TYPE_DR;
  }

  if (!options.was_supplied("csoaa"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("csoaa", ss.str());
  }

  auto base = as_singleline(setup_base(options, all));
  if (eval)
  {
    all.p->lp = CB_EVAL::cb_eval;
    all.label_type = label_type::cb_eval;
  }
  else
  {
    all.p->lp = CB::cb_label;
    all.label_type = label_type::cb;
  }

  learner<cb, example>* l;
  if (eval)
  {
    l = &init_learner(data, base, learn_eval, predict_eval, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(eval_finish_example);
  }
  else
  {
    l = &init_learner(
        data, base, predict_or_learn<true>, predict_or_learn<false>, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(finish_example);
  }
  c.scorer = all.scorer;

  l->set_finish(finish);
  return make_base(*l);
}